

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

enable_if_t<_detail::move_never<InitialState<>_>::value,_InitialState<>_> * __thiscall
pybind11::move<InitialState<double>>
          (enable_if_t<_detail::move_never<InitialState<>_>::value,_InitialState<>_>
           *__return_storage_ptr__,pybind11 *this,object *obj)

{
  itype *piVar1;
  runtime_error *this_00;
  long *plVar2;
  size_type *psVar3;
  type_info *ptVar4;
  make_caster<InitialState<>_> conv;
  handle local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  type_caster_generic local_c8;
  long lStack_b0;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (**(int **)this < 2) {
    detail::type_caster_generic::type_caster_generic
              (&local_c8,(type_info *)&InitialState<double>::typeinfo);
    detail::load_type<InitialState<double>,void>
              ((type_caster<InitialState<double>,_void> *)&local_c8,(handle *)this);
    piVar1 = detail::type_caster_base::operator_cast_to_InitialState_((type_caster_base *)&local_c8)
    ;
    __return_storage_ptr__->T = piVar1->T;
    (__return_storage_ptr__->rhovecL).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
    m_storage.m_data =
         (piVar1->rhovecL).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_data;
    (__return_storage_ptr__->rhovecL).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
    m_storage.m_rows =
         (piVar1->rhovecL).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_rows;
    (piVar1->rhovecL).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
         = (double *)0x0;
    (piVar1->rhovecL).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
         = 0;
    (__return_storage_ptr__->rhovecV).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
    m_storage.m_data =
         (piVar1->rhovecV).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_data;
    (__return_storage_ptr__->rhovecV).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.
    m_storage.m_rows =
         (piVar1->rhovecV).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_rows;
    (piVar1->rhovecV).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
         = (double *)0x0;
    (piVar1->rhovecV).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
         = 0;
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_f0.m_ptr = (PyObject *)PyObject_Str(*(undefined8 *)(*(long *)this + 8));
  str::operator_cast_to_string(&local_a8,(str *)&local_f0);
  std::operator+(&local_68,"Unable to move from Python ",&local_a8);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_68);
  local_e8._M_dataplus._M_p = (pointer)*plVar2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_e8._M_dataplus._M_p == psVar3) {
    local_e8.field_2._M_allocated_capacity = *psVar3;
    local_e8.field_2._8_8_ = plVar2[3];
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  }
  else {
    local_e8.field_2._M_allocated_capacity = *psVar3;
  }
  local_e8._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  type_id<InitialState<double>>();
  std::operator+(&local_48,&local_e8,&local_88);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_48);
  local_c8.typeinfo = (type_info *)*plVar2;
  ptVar4 = (type_info *)(plVar2 + 2);
  if (local_c8.typeinfo == ptVar4) {
    local_c8.value = ptVar4->type;
    lStack_b0 = plVar2[3];
    local_c8.typeinfo = (type_info *)&local_c8.value;
  }
  else {
    local_c8.value = ptVar4->type;
  }
  local_c8.cpptype = (type_info *)plVar2[1];
  *plVar2 = (long)ptVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_c8);
  *(undefined ***)this_00 = &PTR__runtime_error_001abe98;
  __cxa_throw(this_00,&cast_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

detail::enable_if_t<!detail::move_never<T>::value, T> move(object &&obj) {
    if (obj.ref_count() > 1)
#if defined(NDEBUG)
        throw cast_error("Unable to cast Python instance to C++ rvalue: instance has multiple references"
            " (compile in debug mode for details)");
#else
        throw cast_error("Unable to move from Python " + (std::string) str(obj.get_type()) +
                " instance to C++ " + type_id<T>() + " instance: instance has multiple references");
#endif

    // Move into a temporary and return that, because the reference may be a local value of `conv`
    T ret = std::move(detail::load_type<T>(obj).operator T&());
    return ret;
}